

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStderr.cpp
# Opt level: O0

void __thiscall liblogger::LogStderr::Log(LogStderr *this,LogType Type,string *str)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  string *message;
  int *piVar6;
  char *pcVar7;
  ostream *poVar8;
  LogType in_ESI;
  stringstream ss_1;
  stringstream ss;
  char buf [128];
  tm timeinfo;
  time_t current;
  string *in_stack_fffffffffffffb98;
  FILE *__stream;
  stringstream local_420 [16];
  ostream local_410 [383];
  undefined1 local_291;
  stringstream local_260 [16];
  ostream local_250 [376];
  char local_d8 [128];
  tm local_58;
  time_t local_20 [2];
  LogType local_c;
  
  local_c = in_ESI;
  local_20[0] = time((time_t *)0x0);
  localtime_r(local_20,&local_58);
  sVar3 = strftime(local_d8,0x80,"%F %T",&local_58);
  if (sVar3 == 0) {
    abort();
  }
  __stream = _stderr;
  LogTypeToStr_abi_cxx11_(local_c);
  uVar4 = std::__cxx11::string::c_str();
  uVar1 = getpid();
  uVar5 = std::__cxx11::string::c_str();
  iVar2 = fprintf(__stream,"%s - %s [PID: %d] - %s\n",local_d8,uVar4,(ulong)uVar1,uVar5);
  if (iVar2 < 0) {
    std::__cxx11::stringstream::stringstream(local_260);
    message = (string *)std::operator<<(local_250,"failed to write to stderr error:");
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    std::operator<<((ostream *)message,pcVar7);
    local_291 = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    LogException::LogException((LogException *)__stream,message);
    local_291 = 0;
    __cxa_throw(uVar4,&LogException::typeinfo,LogException::~LogException);
  }
  iVar2 = fflush(_stderr);
  if (iVar2 < 0) {
    std::__cxx11::stringstream::stringstream(local_420);
    poVar8 = std::operator<<(local_410,"failed to flush to stderr error:");
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    std::operator<<(poVar8,pcVar7);
    uVar4 = __cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    LogException::LogException((LogException *)__stream,in_stack_fffffffffffffb98);
    __cxa_throw(uVar4,&LogException::typeinfo,LogException::~LogException);
  }
  return;
}

Assistant:

void LogStderr::Log(const LogType Type, const std::string &str) {
	time_t current = time(NULL);
	struct tm timeinfo;
	char buf[128];

	localtime_r(&current, &timeinfo);
	if (strftime(buf, sizeof(buf), "%F %T", &timeinfo) == 0)
		abort(); //Bug

	if (fprintf(stderr, "%s - %s [PID: %d] - %s\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
	{
		std::stringstream ss;
		ss << "failed to write to stderr error:" << strerror(errno);
		throw(LogException(ss.str()));
	}
	if (fflush(stderr) < 0)
	{
		std::stringstream ss;
		ss << "failed to flush to stderr error:" << strerror(errno);
		throw(LogException(ss.str()));
	}
}